

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LibraryDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>&,slang::syntax::LibraryIncDirClauseSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *args_3
          ,LibraryIncDirClauseSyntax **args_4,Token *args_5)

{
  Token semi;
  Token name;
  Token library;
  LibraryDeclarationSyntax *pLVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *in_RSI;
  LibraryIncDirClauseSyntax *in_RDI;
  undefined8 in_R8;
  Info *in_R9;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pLVar1 = (LibraryDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  library.info = in_RCX;
  library.kind = (short)in_R8;
  library._2_1_ = (char)((ulong)in_R8 >> 0x10);
  library.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  library.rawLen = (int)((ulong)in_R8 >> 0x20);
  name.info = in_R9;
  name._0_8_ = in_RDX[1];
  semi.info = in_stack_00000008;
  semi.kind = (short)unaff_retaddr;
  semi._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  semi.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  semi.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::LibraryDeclarationSyntax::LibraryDeclarationSyntax
            ((LibraryDeclarationSyntax *)*in_RDX,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX->location,library,name,
             in_RSI,in_RDI,semi);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }